

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.h
# Opt level: O1

void __thiscall hwnet::TCPSocket::linklist::~linklist(linklist *this)

{
  sendContext *psVar1;
  sendContext *c;
  sendContext *s;
  
  s = this->head;
  if (s != (sendContext *)0x0) {
    do {
      psVar1 = s->next;
      sendContextPool::put((sendContextPool *)sContextPool,s);
      s = psVar1;
    } while (psVar1 != (sendContext *)0x0);
    this->head = (sendContext *)0x0;
    this->tail = (sendContext *)0x0;
  }
  return;
}

Assistant:

~linklist(){
			this->clear();
		}